

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

float * __thiscall Mat::Getf(Mat *this)

{
  double *pdVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (long)this->n_cols_ * (long)this->n_rows_;
  uVar3 = 0xffffffffffffffff;
  if (-1 < (int)uVar4) {
    uVar3 = uVar4 * 4;
  }
  pfVar2 = (float *)operator_new__(uVar3);
  if (0 < (int)uVar4) {
    pdVar1 = this->v_;
    uVar3 = 0;
    do {
      pfVar2[uVar3] = (float)pdVar1[uVar3];
      uVar3 = uVar3 + 1;
    } while ((uVar4 & 0xffffffff) != uVar3);
  }
  return pfVar2;
}

Assistant:

float* Mat::Getf() {
	float * fdata;
	int size = n_rows_*n_cols_;
	fdata = new float[size];
	for(int i = 0; i < size; i++) 
		fdata[i] = (float) v_[i];
	return fdata;
}